

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransportMan.cpp
# Opt level: O2

void __thiscall
adios2::transportman::TransportMan::WriteFiles
          (TransportMan *this,iovec *iov,size_t iovcnt,int transportIndex)

{
  bool bVar1;
  iterator itTransport;
  TransportMan *this_00;
  __node_base *p_Var2;
  string local_70;
  string local_50;
  
  if (transportIndex == -1) {
    p_Var2 = &(this->m_Transports)._M_h._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(_Hash_node_base **)
                                &((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor + 1),
                              "File");
      if (bVar1) {
        (*(code *)(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor)
                  ->_M_nxt[7]._M_nxt)
                  (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor,
                   iov,iovcnt & 0xffffffff,0xffffffffffffffff);
      }
    }
  }
  else {
    local_70._M_dataplus._M_p = (pointer)(long)transportIndex;
    itTransport = std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->m_Transports)._M_h,(key_type *)&local_70);
    std::__cxx11::to_string(&local_70,transportIndex);
    this_00 = (TransportMan *)&local_50;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   ", in call to WriteFiles with index ",&local_70);
    CheckFile(this_00,(const_iterator)
                      itTransport.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false>
                      ._M_cur,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    (**(code **)(**(long **)((long)itTransport.
                                   super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false>
                                   ._M_cur + 0x10) + 0x38))
              (*(long **)((long)itTransport.
                                super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false>
                                ._M_cur + 0x10),iov,iovcnt & 0xffffffff,0xffffffffffffffff);
  }
  return;
}

Assistant:

void TransportMan::WriteFiles(const core::iovec *iov, const size_t iovcnt, const int transportIndex)
{
    if (transportIndex == -1)
    {
        for (auto &transportPair : m_Transports)
        {
            auto &transport = transportPair.second;
            if (transport->m_Type == "File")
            {
                transport->WriteV(iov, static_cast<int>(iovcnt));
            }
        }
    }
    else
    {
        auto itTransport = m_Transports.find(transportIndex);
        CheckFile(itTransport,
                  ", in call to WriteFiles with index " + std::to_string(transportIndex));
        itTransport->second->WriteV(iov, static_cast<int>(iovcnt));
    }
}